

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void units::shorten_number(string *unit_string,size_t loc,size_t length)

{
  pointer pcVar1;
  long lVar2;
  char cVar3;
  char *pcVar4;
  bool bVar5;
  
  pcVar1 = (unit_string->_M_dataplus)._M_p;
  cVar3 = pcVar1[loc];
  if (cVar3 == '.') {
    cVar3 = pcVar1[loc + 1];
  }
  std::__cxx11::string::erase((ulong)unit_string,loc);
  if (cVar3 == '9') {
    pcVar1 = (unit_string->_M_dataplus)._M_p;
    cVar3 = pcVar1[loc - 1];
    if (cVar3 == '9') {
      lVar2 = loc - 1;
      do {
        pcVar4 = (unit_string->_M_dataplus)._M_p;
        if (pcVar4[lVar2] != '9') {
          if (lVar2 == 0) goto LAB_0016ebe2;
          goto LAB_0016ebf6;
        }
        pcVar4[lVar2] = '0';
        bVar5 = lVar2 != 0;
        lVar2 = lVar2 + -1;
      } while (bVar5);
      pcVar4 = (unit_string->_M_dataplus)._M_p;
      lVar2 = 0;
LAB_0016ebe2:
      if (*pcVar4 == '0') {
        std::__cxx11::string::insert(unit_string,pcVar4,0x31);
        return;
      }
LAB_0016ebf6:
      if (9 < (byte)(pcVar4[lVar2] - 0x30U)) {
        std::__cxx11::string::insert((ulong)unit_string,lVar2 + 1,'\x01');
        return;
      }
      pcVar4[lVar2] = pcVar4[lVar2] + '\x01';
    }
    else {
      pcVar1[loc - 1] = cVar3 + '\x01';
    }
  }
  return;
}

Assistant:

static void shorten_number(std::string& unit_string, size_t loc, size_t length)
{
    auto c = unit_string[loc];
    if (c == '.') {
        c = unit_string[loc + 1];
    }
    unit_string.erase(loc, length);
    if (c == '9') {
        if (unit_string[loc - 1] != '9') {
            ++unit_string[loc - 1];
        } else {
            int kk = 1;
            while (unit_string[loc - kk] == '9') {
                unit_string[loc - kk] = '0';
                if (loc - kk == 0) {
                    break;
                }
                ++kk;
            }
            if (loc - kk == 0 && unit_string[0] == '0') {
                unit_string.insert(unit_string.begin(), '1');
            } else {
                if (isDigitCharacter(unit_string[loc - kk])) {
                    ++unit_string[loc - kk];
                } else {
                    unit_string.insert(loc - kk + 1, 1, '1');
                }
            }
        }
    }
}